

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O0

void __thiscall
andres::Partition<unsigned_long>::representativeLabeling
          (Partition<unsigned_long> *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *out)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  iterator __k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  mapped_type *pmVar2;
  Partition<unsigned_long> *in_RDI;
  Index j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  allocator_type *in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::clear((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)0x1594fb);
  it._M_current = (unsigned_long *)numberOfSets(in_RDI);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x159519);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)it._M_current,
             (size_type)in_RDI,in_stack_ffffffffffffff90);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x159539);
  __k = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78)
  ;
  representatives<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_RDI,it);
  local_50 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    pvVar3 = local_50;
    pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)numberOfSets(in_RDI);
    if (pvVar1 <= pvVar3) break;
    pvVar3 = local_50;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&local_28,(size_type)local_50);
    pmVar2 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](in_stack_ffffffffffffffc0,__k._M_current);
    *pmVar2 = (mapped_type)pvVar3;
    local_50 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar3);
  return;
}

Assistant:

inline void 
Partition<T>::representativeLabeling(
    std::map<Index, Index>& out
) const {
    out.clear();	
    std::vector<Index> r(static_cast<std::size_t>(numberOfSets()));
    representatives(r.begin());
    for(Index j = 0; j < numberOfSets(); ++j) {
        out[r[static_cast<std::size_t>(j)]] = j;
    }
}